

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

void xpsr_write(CPUARMState_conflict *env,uint32_t val,uint32_t mask)

{
  uint32_t mask_local;
  uint32_t val_local;
  CPUARMState_conflict *env_local;
  
  if ((mask & 0xf0000000) != 0) {
    env->ZF = (val ^ 0xffffffff) & 0x40000000;
    env->NF = val;
    env->CF = val >> 0x1d & 1;
    env->VF = (val & 0x10000000) << 3;
  }
  if ((mask & 0x8000000) != 0) {
    env->QF = (uint)((val & 0x8000000) != 0);
  }
  if ((mask & 0xf0000) != 0) {
    env->GE = (val & 0xf0000) >> 0x10;
  }
  if ((mask & 0x1000000) != 0) {
    env->thumb = (uint)((val & 0x1000000) != 0);
  }
  if ((mask & 0x6000000) != 0) {
    env->condexec_bits = env->condexec_bits & 0xfffffffc;
    env->condexec_bits = val >> 0x19 & 3 | env->condexec_bits;
  }
  if ((mask & 0xfc00) != 0) {
    env->condexec_bits = env->condexec_bits & 3;
    env->condexec_bits = val >> 8 & 0xfc | env->condexec_bits;
  }
  if ((mask & 0x1ff) != 0) {
    write_v7m_exception_aarch64(env,val & 0x1ff);
  }
  return;
}

Assistant:

static inline void xpsr_write(CPUARMState *env, uint32_t val, uint32_t mask)
{
    if (mask & XPSR_NZCV) {
        env->ZF = (~val) & XPSR_Z;
        env->NF = val;
        env->CF = (val >> 29) & 1;
        env->VF = (val << 3) & 0x80000000;
    }
    if (mask & XPSR_Q) {
        env->QF = ((val & XPSR_Q) != 0);
    }
    if (mask & XPSR_GE) {
        env->GE = (val & XPSR_GE) >> 16;
    }
    if (mask & XPSR_T) {
        env->thumb = ((val & XPSR_T) != 0);
    }
    if (mask & XPSR_IT_0_1) {
        env->condexec_bits &= ~3;
        env->condexec_bits |= (val >> 25) & 3;
    }
    if (mask & XPSR_IT_2_7) {
        env->condexec_bits &= 3;
        env->condexec_bits |= (val >> 8) & 0xfc;
    }
    if (mask & XPSR_EXCP) {
        /* Note that this only happens on exception exit */
        write_v7m_exception(env, val & XPSR_EXCP);
    }
}